

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::ExpectError
          (TextureAttachmentErrorsTest *this,GLenum expected_error,GLchar *function_name,
          bool framebuffer,bool attachment,bool color_attachment,bool texture,bool level,
          GLchar *texture_type,bool layer)

{
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  bool *pbVar7;
  char *pcVar8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    iVar3 = (int)(ostringstream *)&local_1a8;
    if (function_name == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(function_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,function_name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," called with ",0xd);
    pcVar8 = "invalid";
    pcVar6 = "invalid";
    if (framebuffer) {
      pcVar6 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar6,(ulong)!framebuffer * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," framebuffer, ",0xe);
    pcVar6 = "invalid";
    if (attachment) {
      pcVar6 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar6,(ulong)!attachment * 2 + 5);
    pbVar7 = (bool *)0x1b3e787;
    if (!color_attachment) {
      pbVar7 = ::glcts::fixed_sample_locations_values + 1;
    }
    lVar5 = 6;
    if (!color_attachment) {
      lVar5 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pbVar7,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," attachment, ",0xd);
    pcVar6 = "invalid ";
    if (texture) {
      pcVar6 = "valid ";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar6,(ulong)!texture * 2 + 6);
    if (texture_type == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(texture_type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,texture_type,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," texture, ",10);
    if (level) {
      pcVar8 = "valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar8,(ulong)!level * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," level",6);
    pcVar6 = ", with invalid layer number";
    if (layer) {
      pcVar6 = ::glcts::fixed_sample_locations_values + 1;
    }
    lVar5 = 0x1b;
    if (layer) {
      lVar5 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," was expected to generate ",0x1a);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", but ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," was observed instead.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  do {
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar3 != 0);
  return GVar2 == expected_error;
}

Assistant:

bool TextureAttachmentErrorsTest::ExpectError(glw::GLenum expected_error, const glw::GLchar* function_name,
											  bool framebuffer, bool attachment, bool color_attachment, bool texture,
											  bool level, const glw::GLchar* texture_type, bool layer)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << function_name << " called with " << (framebuffer ? "valid" : "invalid")
			<< " framebuffer, " << (attachment ? "valid" : "invalid") << (color_attachment ? " color" : "")
			<< " attachment, " << (texture ? "valid " : "invalid ") << texture_type << " texture, "
			<< (level ? "valid" : "invalid") << " level" << (layer ? "" : ", with invalid layer number")
			<< " was expected to generate " << glu::getErrorStr(expected_error) << ", but " << glu::getErrorStr(error)
			<< " was observed instead." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}